

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

void __thiscall
flatbuffers::JsonPrinter::GenField<unsigned_int>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  ushort uVar1;
  uint val;
  ushort uVar2;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,fixed) == 0) {
    if (fd->presence == kOptional) {
      uVar2 = (fd->value).offset;
      uVar1 = 0;
      if (uVar2 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar1 = *(ushort *)(table + ((ulong)uVar2 - (long)*(int *)table));
      }
      if (uVar1 == 0) {
        std::__cxx11::string::append((char *)this->text);
        return;
      }
      val = *(uint *)(table + uVar1);
    }
    else {
      uVar2 = (fd->value).offset;
      val = GetFieldDefault<unsigned_int>(fd);
      if (uVar2 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar2 = *(ushort *)(table + ((ulong)uVar2 - (long)*(int *)table));
      }
      else {
        uVar2 = 0;
      }
      if (uVar2 != 0) {
        val = *(uint *)(table + uVar2);
      }
    }
  }
  else {
    val = *(uint *)(table + (fd->value).offset);
  }
  PrintScalar<unsigned_int>(this,val,&(fd->value).type,indent);
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }